

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClassMethodDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::syntax::FunctionDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,FunctionDeclarationSyntax *args_2)

{
  ClassMethodDeclarationSyntax *this_00;
  
  this_00 = (ClassMethodDeclarationSyntax *)allocate(this,0x90,8);
  slang::syntax::ClassMethodDeclarationSyntax::ClassMethodDeclarationSyntax
            (this_00,args,args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }